

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O0

ssize_t __thiscall
lrit::HeaderReader<lrit::AnnotationHeader>::read
          (HeaderReader<lrit::AnnotationHeader> *this,int __fd,void *__buf,size_t __nbytes)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __end;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  this_00;
  undefined4 in_register_00000034;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  b;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  a;
  difference_type in_stack_ffffffffffffff70;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffff78;
  allocator<char> *in_stack_ffffffffffffff88;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffffa0;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  __end = __gnu_cxx::
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  __gnu_cxx::
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  this_00 = __gnu_cxx::
            __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00._M_current
             ,in_stack_ffffffffffffffa0,__end,in_stack_ffffffffffffff88);
  std::__cxx11::string::operator=
            ((string *)CONCAT44(in_register_00000034,__fd),(string *)&stack0xffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  this->p_ = this->p_ + (int)__buf;
  return (ssize_t)this;
}

Assistant:

void read(std::string& dst, size_t len) {
    auto a = b_.begin() + p_;
    auto b = b_.begin() + p_ + len;
    dst = std::string(a, b);
    p_ += len;
  }